

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeIteratorPrototype
               (DynamicObject *iteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  DeferredTypeHandlerBase::Convert(typeHandler,iteratorPrototype,mode,1,0);
  AddFunctionToLibraryObjectWithName
            ((((iteratorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr,
             iteratorPrototype,0x14,0x2c5,
             (FunctionInfo *)JavascriptIterator::EntryInfo::SymbolIterator,0);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeIteratorPrototype(DynamicObject* iteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(iteratorPrototype, mode, 1);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = iteratorPrototype->GetLibrary();

        library->AddFunctionToLibraryObjectWithName(iteratorPrototype, PropertyIds::_symbolIterator, PropertyIds::_RuntimeFunctionNameId_iterator,
            &JavascriptIterator::EntryInfo::SymbolIterator, 0);

        return true;
    }